

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

float __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<float,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  size_t i;
  uint uVar5;
  int iVar6;
  unsigned_fast_type uVar7;
  value_type_conflict *x;
  int iVar8;
  limb_type lm_mask;
  uint uVar9;
  bool bVar10;
  float fVar11;
  uintwide_t<256U,_unsigned_int,_void,_true> tmp;
  local_unsigned_wide_integer_type u;
  
  iVar1 = *(int *)(this + 0x1c);
  tmp.values.super_array<unsigned_int,_8UL>.elems._0_8_ = *(undefined8 *)this;
  tmp.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  tmp.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  if (iVar1 < 0) {
    uintwide_t<256U,_unsigned_int,_void,_true>::negate(&tmp);
  }
  x = (value_type_conflict *)&u;
  u.values.super_array<unsigned_int,_8UL>.elems[4] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[4];
  u.values.super_array<unsigned_int,_8UL>.elems[5] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[5];
  u.values.super_array<unsigned_int,_8UL>.elems[6] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[6];
  u.values.super_array<unsigned_int,_8UL>.elems[7] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[7];
  u.values.super_array<unsigned_int,_8UL>.elems[0] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[0];
  u.values.super_array<unsigned_int,_8UL>.elems[1] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[1];
  u.values.super_array<unsigned_int,_8UL>.elems[2] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[2];
  u.values.super_array<unsigned_int,_8UL>.elems[3] =
       tmp.values.super_array<unsigned_int,_8UL>.elems[3];
  uVar7 = msb<256u,unsigned_int,void,false>((uintwide_t<256U,_unsigned_int,_void,_false> *)x);
  uVar5 = (int)uVar7 + 1;
  fVar11 = 0.0;
  fVar3 = 1.0;
  for (iVar6 = 0; iVar6 != ((uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0); iVar6 = iVar6 + 1) {
    iVar8 = 0x20;
    uVar9 = 1;
    fVar2 = 0.0;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      fVar4 = fVar2 + fVar3;
      if ((*x & uVar9) == 0) {
        fVar4 = fVar2;
      }
      fVar2 = fVar4;
      uVar9 = uVar9 * 2;
      fVar3 = fVar3 + fVar3;
    }
    fVar11 = fVar11 + fVar2;
    x = x + 1;
  }
  if (iVar1 < 0) {
    fVar11 = -fVar11;
  }
  return fVar11;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }